

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_TextureCombineColor_16_to_24(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  u16 c1;
  u16 uVar5;
  u32 uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  long in_RDI;
  u8 *writeTo_1;
  u32 color_1;
  u32 dx_1;
  u32 dy_1;
  u8 *writeTo;
  u32 color;
  u32 src_x;
  u32 dx;
  u32 src_y;
  u32 dy;
  float hscale;
  float wscale;
  u16 jobColor;
  u8 *dst;
  u16 *src;
  u32 h;
  u32 w;
  uint local_50;
  uint local_4c;
  uint local_38;
  uint local_30;
  long local_20;
  long local_18;
  
  uVar3 = *(uint *)(in_RDI + 0x38);
  uVar4 = *(uint *)(in_RDI + 0x3c);
  local_18 = *(long *)(in_RDI + 0x28);
  local_20 = *(long *)(in_RDI + 0x30);
  c1 = video::A8R8G8B8toA1R5G5B5(*(u32 *)(in_RDI + 0x20));
  if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
    for (local_4c = 0; local_4c != uVar4; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 != uVar3; local_50 = local_50 + 1) {
        uVar6 = video::A1R5G5B5toA8R8G8B8(*(u16 *)(local_18 + (ulong)local_50 * 2));
        uVar5 = PixelMul16_2((u16)uVar6,c1);
        puVar9 = (undefined1 *)(local_20 + (ulong)(local_50 * 3));
        uVar6 = video::getAlpha(*(u16 *)(local_18 + (ulong)local_50 * 2));
        if (uVar6 != 0) {
          *puVar9 = 0;
          puVar9[1] = (char)(uVar5 >> 8);
          puVar9[2] = (char)uVar5;
        }
      }
      local_18 = local_18 + *(int *)(in_RDI + 0x48);
      local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    }
  }
  else {
    fVar1 = *(float *)(in_RDI + 0x54);
    fVar2 = *(float *)(in_RDI + 0x58);
    for (local_30 = 0; local_30 < uVar4; local_30 = local_30 + 1) {
      lVar7 = *(long *)(in_RDI + 0x28) +
              (ulong)(uint)(*(int *)(in_RDI + 0x48) * (int)(long)((float)local_30 * fVar2));
      for (local_38 = 0; local_38 < uVar3; local_38 = local_38 + 1) {
        uVar8 = (ulong)((float)local_38 * fVar1);
        uVar6 = video::A1R5G5B5toA8R8G8B8(*(u16 *)(lVar7 + (uVar8 & 0xffffffff) * 2));
        uVar5 = PixelMul16_2((u16)uVar6,c1);
        puVar9 = (undefined1 *)(local_20 + (ulong)(local_38 * 3));
        uVar6 = video::getAlpha(*(u16 *)(lVar7 + (uVar8 & 0xffffffff) * 2));
        if (uVar6 != 0) {
          *puVar9 = 0;
          puVar9[1] = (char)(uVar5 >> 8);
          puVar9[2] = (char)uVar5;
        }
      }
      local_20 = local_20 + (ulong)*(uint *)(in_RDI + 0x4c);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCombineColor_16_to_24(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u16 *src = static_cast<const u16 *>(job->src);
	u8 *dst = static_cast<u8 *>(job->dst);

	const u16 jobColor = video::A8R8G8B8toA1R5G5B5(job->argb);

	if (job->stretch) {
		const float wscale = job->x_stretch;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u16 *)((u8 *)(job->src) + job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u32 src_x = (u32)(dx * wscale);
				u32 color = PixelMul16_2(video::A1R5G5B5toA8R8G8B8(src[src_x]), jobColor);
				u8 *writeTo = &dst[dx * 3];
				if (video::getAlpha(src[src_x]) > 0) { // only overlay if source has visible alpha (alpha == 1)
					*writeTo++ = (color >> 16) & 0xFF;
					*writeTo++ = (color >> 8) & 0xFF;
					*writeTo++ = color & 0xFF;
				}
			}
			dst += job->dstPitch;
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			for (u32 dx = 0; dx != w; ++dx) {
				u32 color = PixelMul16_2(video::A1R5G5B5toA8R8G8B8(src[dx]), jobColor);
				u8 *writeTo = &dst[dx * 3];
				if (video::getAlpha(src[dx]) > 0) { // only overlay if source has visible alpha (alpha == 1)
					*writeTo++ = (color >> 16) & 0xFF;
					*writeTo++ = (color >> 8) & 0xFF;
					*writeTo++ = color & 0xFF;
				}
			}

			src = (u16 *)((u8 *)(src) + job->srcPitch);
			dst += job->dstPitch;
		}
	}
}